

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O0

void __thiscall
my_algorithm::WeightedDigraphSPDijkstra<int,_int>::WeightedDigraphSPDijkstra
          (WeightedDigraphSPDijkstra<int,_int> *this,WeightedDigraph<int,_int> *graph,int vertex)

{
  WeightedGraph<int,_int> *graph_00;
  bool bVar1;
  undefined1 local_68 [48];
  Node *local_38;
  Node *start;
  int local_1c;
  WeightedGraph<int,_int> *pWStack_18;
  int vertex_local;
  WeightedDigraph<int,_int> *graph_local;
  WeightedDigraphSPDijkstra<int,_int> *this_local;
  
  this->_vptr_WeightedDigraphSPDijkstra = (_func_int **)&PTR__WeightedDigraphSPDijkstra_00116a80;
  local_1c = vertex;
  pWStack_18 = &graph->super_WeightedGraph<int,_int>;
  graph_local = (WeightedDigraph<int,_int> *)this;
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::SymbolTable(&this->_edge_to);
  data_structures::SymbolTable<int,_int>::SymbolTable(&this->_weight_to);
  data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
  PriorityQueue(&this->_queue);
  this->_start = local_1c;
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::clear(&this->_edge_to);
  data_structures::SymbolTable<int,_int>::clear(&this->_weight_to);
  data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
  clear(&this->_queue);
  local_38 = data_structures::WeightedGraph<int,_int>::getNode(pWStack_18,&local_1c);
  data_structures::
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  ::WeightedGraphEdge((WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
                       *)(local_68 + 0x18),local_38,local_38,0);
  data_structures::
  SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::set(&this->_edge_to,&local_1c,
        (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
         *)(local_68 + 0x18));
  local_68._20_4_ = 0;
  data_structures::SymbolTable<int,_int>::set(&this->_weight_to,&local_1c,(int *)(local_68 + 0x14));
  local_68._8_4_ = 0;
  SPElement::SPElement((SPElement *)(local_68 + 0xc),this->_start,(int *)(local_68 + 8));
  data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
  enqueue(&this->_queue,(SPElement *)(local_68 + 0xc));
  while( true ) {
    bVar1 = data_structures::
            PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::isEmpty
                      (&this->_queue);
    graph_00 = pWStack_18;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
    dequeueMinN((PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
                local_68,(size_t)&this->_queue);
    _relax(this,(WeightedDigraph<int,_int> *)graph_00,(SPElement *)local_68);
  }
  return;
}

Assistant:

WeightedDigraphSPDijkstra(WeightedDigraph<T, Weight> &graph, T vertex) {
            _start = vertex;
            _edge_to.clear();
            _weight_to.clear();
            _queue.clear();
            auto start = graph.getNode(vertex);
            _edge_to.set(vertex, Edge(start, start, Weight()));
            _weight_to.set(vertex, Weight());
            _queue.enqueue(SPElement(_start, Weight()));
            while (!_queue.isEmpty()) {
                _relax(graph, _queue.dequeueMinN(1));
            }
        }